

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O3

void cmakemainProgressCallback(char *m,float prog,void *clientdata)

{
  cmMakefile *this;
  int iVar1;
  size_t sVar2;
  ostream *poVar3;
  cmake *cm;
  string dir;
  char *local_60;
  long local_58;
  char local_50;
  undefined7 uStack_4f;
  string local_40;
  
  if (((clientdata == (void *)0x0) || (*(char *)((long)clientdata + 200) != '\x01')) ||
     (*(long *)((long)clientdata + 0x30) == 0)) {
    local_60 = &local_50;
    local_58 = 0;
    local_50 = '\0';
  }
  else {
    this = *(cmMakefile **)(*(long *)((long)clientdata + 0x30) + 0xa8);
    local_60 = &local_50;
    local_58 = 0;
    local_50 = '\0';
    if (this != (cmMakefile *)0x0) {
      iVar1 = strncmp(m,"Configuring",0xb);
      if ((0.0 <= prog) || (iVar1 != 0)) {
        iVar1 = strncmp(m,"Generating",10);
        if (iVar1 != 0) goto LAB_002539c1;
        std::__cxx11::string::_M_replace((ulong)&local_60,0,(char *)0x0,0x574e75);
        cmMakefile::GetCurrentBinaryDirectory(this);
      }
      else {
        std::__cxx11::string::_M_replace((ulong)&local_60,0,(char *)0x0,0x574e75);
        cmMakefile::GetCurrentSourceDirectory(this);
      }
      std::__cxx11::string::append((char *)&local_60);
    }
  }
LAB_002539c1:
  if ((prog < 0.0) || (local_58 != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- ",3);
    if (m == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x69b6b0);
    }
    else {
      sVar2 = strlen(m);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,m,sVar2);
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_60,local_58);
    cmakemainGetStack_abi_cxx11_(&local_40,clientdata);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_40._M_dataplus._M_p,local_40._M_string_length);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  std::ostream::flush();
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return;
}

Assistant:

static void cmakemainProgressCallback(const char* m, float prog,
                                      void* clientdata)
{
  cmMakefile* mf = cmakemainGetMakefile(clientdata);
  std::string dir;
  if ((mf) && (strstr(m, "Configuring") == m) && (prog < 0)) {
    dir = " ";
    dir += mf->GetCurrentSourceDirectory();
  } else if ((mf) && (strstr(m, "Generating") == m)) {
    dir = " ";
    dir += mf->GetCurrentBinaryDirectory();
  }

  if ((prog < 0) || (!dir.empty())) {
    std::cout << "-- " << m << dir << cmakemainGetStack(clientdata)
              << std::endl;
  }

  std::cout.flush();
}